

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O1

void __thiscall L13_2::BankAccountPlus::withdraw(BankAccountPlus *this,double amount)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  ostream *poVar4;
  double dVar5;
  
  lVar3 = std::cout;
  uVar1 = *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18));
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0xfffffefb | 4;
  uVar2 = *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18));
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = 2;
  dVar5 = (this->super_BankAccount)._balance;
  if (dVar5 <= amount) {
    if ((this->_max_loan + dVar5) - this->_loan <= amount) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Credit limit exceeded, Transaction aborted.\n",0x2c);
      goto LAB_00111f80;
    }
    dVar5 = amount - dVar5;
    this->_loan = (this->_rate + 1.0) * dVar5 + this->_loan;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"credit loan amount: $",0x15);
    poVar4 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"credit loan charge: $",0x15);
    poVar4 = std::ostream::_M_insert<double>(this->_rate * dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    BankAccount::deposit(&this->super_BankAccount,dVar5);
  }
  BankAccount::withdraw(&this->super_BankAccount,amount);
LAB_00111f80:
  lVar3 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0x104 |
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = uVar2;
  return;
}

Assistant:

void BankAccountPlus::withdraw(double amount) {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  当前余额
//        double balance = get_balance();
        //  access through protected member
        double balance = _balance;
        if (amount < balance) {
            BankAccount::withdraw(amount);
        } else if (amount < balance + _max_loan - _loan) {
            //  取款同时进行信用贷款
            double loan = amount - balance;
            _loan += loan * (1.0 + _rate);
            cout << "credit loan amount: $" << loan << endl;
            cout << "credit loan charge: $" << loan * _rate << endl;
            //  先把不够的部分存进去
            deposit(loan);
            //  再取出来总的借贷额
            BankAccount::withdraw(amount);
        } else {
            cout << "Credit limit exceeded, Transaction aborted.\n";
        }

        reset_format(initState, initPrec);
    }